

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall Catch::Generators::Generators<LargeNumbers>::next(Generators<LargeNumbers> *this)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  reference this_00;
  bool current_status;
  Generators<LargeNumbers> *this_local;
  
  uVar1 = this->m_current;
  sVar3 = clara::std::
          vector<Catch::Generators::GeneratorWrapper<LargeNumbers>,_std::allocator<Catch::Generators::GeneratorWrapper<LargeNumbers>_>_>
          ::size(&this->m_generators);
  if (uVar1 < sVar3) {
    this_00 = clara::std::
              vector<Catch::Generators::GeneratorWrapper<LargeNumbers>,_std::allocator<Catch::Generators::GeneratorWrapper<LargeNumbers>_>_>
              ::operator[](&this->m_generators,this->m_current);
    bVar2 = GeneratorWrapper<LargeNumbers>::next(this_00);
    if (!bVar2) {
      this->m_current = this->m_current + 1;
    }
    uVar1 = this->m_current;
    sVar3 = clara::std::
            vector<Catch::Generators::GeneratorWrapper<LargeNumbers>,_std::allocator<Catch::Generators::GeneratorWrapper<LargeNumbers>_>_>
            ::size(&this->m_generators);
    this_local._7_1_ = uVar1 < sVar3;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool next() override {
            if (m_current >= m_generators.size()) {
                return false;
            }
            const bool current_status = m_generators[m_current].next();
            if (!current_status) {
                ++m_current;
            }
            return m_current < m_generators.size();
        }